

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O1

void __thiscall pg::PTLSolver::solve(PTLSolver *this)

{
  bitset *src;
  bitset *Z;
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint *puVar6;
  size_t sVar7;
  bool bVar8;
  ostream *poVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  bitset CurG;
  bool local_59;
  bitset local_50;
  
  local_50._size = ((this->super_Solver).game)->n_vertices;
  uVar12 = local_50._size + 0x3f;
  local_50._bitssize = uVar12 >> 6;
  uVar11 = local_50._bitssize << 3;
  local_50._allocsize = uVar11;
  local_50._bits = (uint64_t *)operator_new__(uVar11);
  if (0x3f < uVar12) {
    memset(local_50._bits,0,uVar11);
  }
  this->iterations = 0;
  src = &this->G;
  Z = &this->S0;
  local_59 = true;
  bVar8 = true;
  do {
    sVar5 = (this->G)._bitssize;
    sVar7 = 0;
    do {
      sVar10 = sVar7;
      if (sVar5 == sVar10) goto LAB_001735f6;
      sVar7 = sVar10 + 1;
    } while ((this->G)._bits[sVar10] == 0);
    if (sVar5 == sVar10) break;
    this->iterations = this->iterations + 1;
    if (this->multiplayer == false) {
      if (bVar8 != false) {
        do {
          this->iterations = this->iterations + 1;
          if ((this->super_Solver).trace != 0) {
            poVar9 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->iterations + -1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m, player Even\n",0x11);
          }
          bitset::operator=(&local_50,src);
          bVar8 = search(this,&local_50,(int)((this->super_Solver).game)->n_vertices + -1,0);
          iVar2 = (this->SolvedQ0).pointer;
          if (iVar2 != 0) {
            puVar6 = (this->Q).queue;
            (this->Q).queue = (this->SolvedQ0).queue;
            (this->SolvedQ0).queue = puVar6;
            iVar3 = (this->Q).pointer;
            (this->Q).pointer = iVar2;
            (this->SolvedQ0).pointer = iVar3;
            while( true ) {
              iVar2 = (this->Q).pointer;
              if ((long)iVar2 == 0) break;
              (this->Q).pointer = iVar2 + -1;
              uVar4 = (this->Q).queue[(long)iVar2 + -1];
              uVar11 = (ulong)(int)uVar4;
              if (((((this->super_Solver).game)->solved)._bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1)
                  == 0) {
                Oink::solve((this->super_Solver).oink,uVar4,0,this->str[uVar11]);
              }
              puVar1 = (this->G)._bits + (uVar11 >> 6);
              *puVar1 = *puVar1 & ~(1L << (uVar11 & 0x3f));
              attractVertices(this,0,uVar4,src,Z,src);
              attractTangles(this,0,uVar4,src,Z,src);
            }
          }
        } while (bVar8);
      }
      if (local_59 != false) {
        if ((this->super_Solver).trace != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->iterations + -1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m, player Odd\n",0x10);
        }
        bitset::operator=(&local_50,src);
        local_59 = search(this,&local_50,(int)((this->super_Solver).game)->n_vertices + -1,1);
      }
    }
    else {
      if ((this->super_Solver).trace != 0) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->iterations + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m\n",4);
      }
      bitset::operator=(&local_50,src);
      search(this,&local_50,(int)((this->super_Solver).game)->n_vertices + -1,-1);
    }
    iVar2 = (this->SolvedQ0).pointer;
    if (iVar2 != 0) {
      puVar6 = (this->Q).queue;
      (this->Q).queue = (this->SolvedQ0).queue;
      (this->SolvedQ0).queue = puVar6;
      iVar3 = (this->Q).pointer;
      (this->Q).pointer = iVar2;
      (this->SolvedQ0).pointer = iVar3;
      while( true ) {
        iVar2 = (this->Q).pointer;
        if ((long)iVar2 == 0) break;
        (this->Q).pointer = iVar2 + -1;
        uVar4 = (this->Q).queue[(long)iVar2 + -1];
        uVar11 = (ulong)(int)uVar4;
        if (((((this->super_Solver).game)->solved)._bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)
        {
          Oink::solve((this->super_Solver).oink,uVar4,0,this->str[uVar11]);
        }
        puVar1 = (this->G)._bits + (uVar11 >> 6);
        *puVar1 = *puVar1 & ~(1L << (uVar11 & 0x3f));
        attractVertices(this,0,uVar4,src,Z,src);
        attractTangles(this,0,uVar4,src,Z,src);
      }
    }
    iVar2 = (this->SolvedQ1).pointer;
    if (iVar2 != 0) {
      puVar6 = (this->Q).queue;
      (this->Q).queue = (this->SolvedQ1).queue;
      (this->SolvedQ1).queue = puVar6;
      iVar3 = (this->Q).pointer;
      (this->Q).pointer = iVar2;
      (this->SolvedQ1).pointer = iVar3;
      while( true ) {
        iVar2 = (this->Q).pointer;
        if ((long)iVar2 == 0) break;
        (this->Q).pointer = iVar2 + -1;
        uVar4 = (this->Q).queue[(long)iVar2 + -1];
        uVar11 = (ulong)(int)uVar4;
        if (((((this->super_Solver).game)->solved)._bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)
        {
          Oink::solve((this->super_Solver).oink,uVar4,1,this->str[uVar11]);
        }
        puVar1 = (this->G)._bits + (uVar11 >> 6);
        *puVar1 = *puVar1 & ~(1L << (uVar11 & 0x3f));
        attractVertices(this,1,uVar4,src,&this->S1,src);
        attractTangles(this,1,uVar4,src,&this->S1,src);
      }
    }
  } while ((bVar8 != false) || (local_59 != false));
LAB_001735f6:
  if (local_50._bits != (uint64_t *)0x0) {
    operator_delete__(local_50._bits);
  }
  return;
}

Assistant:

void
PTLSolver::solve()
{
    bitset CurG(nodecount());

    iterations = 0;

    bool play0 = true;
    bool play1 = true;

    while (G.any()) {
        iterations++;

        if (multiplayer) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m\n";
            CurG = G;
            search(CurG, nodecount()-1, -1);
        } else {
            // play for player 0 until no changes, then player 1

            while (play0) {
                iterations++;
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Even\n";
                CurG = G;
                play0 = search(CurG, nodecount()-1, 0);

                if (SolvedQ0.nonempty()) {
                    Q.swap(SolvedQ0);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        // TODO: should we need the check?
                        if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                        G[v] = false; // remove from Game
                        attractVertices(0, v, G, S0, G);
                        attractTangles(0, v, G, S0, G);
                    }
                }
            }

            if (play1) {
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Odd\n";
                CurG = G;
                play1 = search(CurG, nodecount()-1, 1);
            }
        }

        /**
         * Extend any dominions that were found.
         * (Any solved vertices are now in <Q>.)
         */

        if (SolvedQ0.nonempty()) {
            Q.swap(SolvedQ0);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                G[v] = false; // remove from Game
                attractVertices(0, v, G, S0, G);
                attractTangles(0, v, G, S0, G);
            }
        }

        if (SolvedQ1.nonempty()) {
            Q.swap(SolvedQ1);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 1, str[v]);
                G[v] = false; // remove from Game
                attractVertices(1, v, G, S1, G);
                attractTangles(1, v, G, S1, G);
            }
        }

        if (!play0 and !play1) break;

#if NDEBUG and 0
        if (iterations == 1000) {
            logger << "stuck\n";
            exit(-1);
        }
#endif
    }
}